

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

RegEx * YAML::Exp::PlainScalar(void)

{
  int iVar1;
  RegEx *pRVar2;
  string local_138;
  string local_118;
  RegEx local_f8;
  RegEx local_d8;
  RegEx local_b8;
  RegEx local_98;
  RegEx local_78;
  RegEx local_58;
  RegEx local_38;
  
  if (PlainScalar()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&PlainScalar()::e);
    if (iVar1 != 0) {
      pRVar2 = BlankOrBreak();
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,",[]{}#&*!|>\'\"%@`","");
      RegEx::RegEx(&local_78,&local_118,REGEX_OR);
      operator|(&local_58,pRVar2,&local_78);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-?:","");
      RegEx::RegEx(&local_b8,&local_138,REGEX_OR);
      pRVar2 = BlankOrBreak();
      RegEx::RegEx(&local_f8);
      operator|(&local_d8,pRVar2,&local_f8);
      operator+(&local_98,&local_b8,&local_d8);
      operator|(&local_38,&local_58,&local_98);
      operator!(&PlainScalar::e,&local_38);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_38.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_98.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d8.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f8.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b8.m_params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_58.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_78.m_params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      __cxa_atexit(RegEx::~RegEx,&PlainScalar::e,&__dso_handle);
      __cxa_guard_release(&PlainScalar()::e);
    }
  }
  return &PlainScalar::e;
}

Assistant:

inline const RegEx& PlainScalar() {
  static const RegEx e =
      !(BlankOrBreak() | RegEx(",[]{}#&*!|>\'\"%@`", REGEX_OR) |
        (RegEx("-?:", REGEX_OR) + (BlankOrBreak() | RegEx())));
  return e;
}